

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

void chaiscript::bootstrap::construct_pod<char16_t>(string *type,Module *m)

{
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<char16_t(chaiscript::Boxed_Number_const&),chaiscript::bootstrap::construct_pod<char16_t>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(chaiscript::Boxed_Number_const&)_1_>,chaiscript::bootstrap::construct_pod<char16_t>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(chaiscript::Boxed_Number_const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_40);
  std::__cxx11::string::string((string *)&local_30,type);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void construct_pod(const std::string &type, Module &m) {
    m.add(fun([](const Boxed_Number &bn) { return bn.get_as<T>(); }), type);
  }